

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecAnalyzerSettings.cpp
# Opt level: O0

bool __thiscall HdmiCecAnalyzerSettings::SetSettingsFromInterfaces(HdmiCecAnalyzerSettings *this)

{
  char *pcVar1;
  Channel local_20 [16];
  HdmiCecAnalyzerSettings *local_10;
  HdmiCecAnalyzerSettings *this_local;
  
  local_10 = this;
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mCecChannelInterface);
  AnalyzerSettingInterfaceChannel::GetChannel();
  Channel::operator=(&this->mCecChannel,local_20);
  Channel::~Channel(local_20);
  AnalyzerSettings::ClearChannels();
  pcVar1 = HdmiCec::GetProtocolName();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mCecChannel,SUB81(pcVar1,0));
  return true;
}

Assistant:

bool HdmiCecAnalyzerSettings::SetSettingsFromInterfaces()
{
    mCecChannel = mCecChannelInterface->GetChannel();

    ClearChannels();
    AddChannel( mCecChannel, HdmiCec::GetProtocolName(), true );

    return true;
}